

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O3

int mattacku(monst *mtmp)

{
  int *piVar1;
  schar sVar2;
  byte bVar3;
  uchar uVar4;
  monst *pmVar5;
  boolean bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  obj *poVar10;
  permonst *ppVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  int tmp;
  uint uVar15;
  long lVar16;
  char cVar17;
  undefined4 uVar18;
  undefined8 unaff_R12;
  attack *mattk;
  ulong uVar19;
  char cVar20;
  int iVar21;
  undefined8 unaff_R14;
  undefined8 uVar22;
  ulong uVar23;
  byte bVar24;
  attack alt_attk;
  int sum [6];
  musable musable;
  int local_27c;
  permonst *local_278;
  attack local_26c;
  char *local_268;
  uint local_25c;
  int local_258;
  uint local_254;
  d_level *local_250;
  d_level *local_248;
  undefined8 local_240;
  int local_238 [2];
  undefined1 local_230;
  musable local_138 [6];
  
  local_278 = mtmp->data;
  iVar7 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
  bVar6 = monnear(mtmp,(int)mtmp->mux,(int)mtmp->muy);
  uVar18 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),bVar6 == '\0');
  if (mtmp->mux == u.ux) {
    uVar22 = CONCAT71((int7)((ulong)unaff_R14 >> 8),mtmp->muy == u.uy);
  }
  else {
    uVar22 = 0;
  }
  uVar9 = (uint)uVar22;
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001cc5ce;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001cc568;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001cc563;
    }
    else {
LAB_001cc563:
      if (ublindf == (obj *)0x0) goto LAB_001cc528;
LAB_001cc568:
      bVar24 = 1;
      if (ublindf->oartifact != '\x1d') goto LAB_001cc626;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (bVar24 = 1, ((youmonst.data)->mflags3 & 0x100) != 0)) &&
        (bVar24 = 1, (viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) &&
       ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_001cc5ce;
  }
  else {
    bVar6 = worm_known(level,mtmp);
    if (bVar6 == '\0') {
LAB_001cc528:
      bVar24 = 1;
    }
    else {
LAB_001cc5ce:
      uVar15 = *(uint *)&mtmp->field_0x60;
      if ((((uVar15 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        bVar24 = 1;
        if (-1 < (char)uVar15) goto LAB_001cc60e;
      }
      else {
        bVar24 = 1;
        if ((-1 < (char)uVar15) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001cc60e:
          bVar24 = (u._1052_1_ & 0x20) >> 5 | (byte)(uVar15 >> 9) & 1;
        }
      }
    }
  }
LAB_001cc626:
  if (iVar7 < 4) {
    nomul(0,(char *)0x0);
  }
  pmVar5 = u.ustuck;
  if (mtmp->mhp < 1) {
    return 0;
  }
  if (((u._1052_1_ & 2) != 0) && ((mtmp->data->mflags1 & 2) == 0)) {
    return 0;
  }
  if ((u._1052_1_ & 1) == 0) {
    if (u.usteed != (monst *)0x0) {
      if (u.usteed == mtmp) {
        return 0;
      }
      uVar15 = mtmp->data->mflags2;
      uVar8 = mt_random();
      if ((((uint)(-1 < (char)uVar15) * 2 + 1 & uVar8) == 0) &&
         (iVar7 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar7 < 3)) {
        uVar9 = mattackm(mtmp,u.usteed);
        if ((uVar9 & 4) != 0) {
          return 1;
        }
        if ((uVar9 & 2) != 0) {
          return 0;
        }
        if (u.umoved == '\0') {
          uVar9 = mattackm(u.usteed,mtmp);
          return uVar9 >> 1 & 1;
        }
        return 0;
      }
    }
  }
  else {
    if (u.ustuck != mtmp) {
      return 0;
    }
    (u.ustuck)->mux = u.ux;
    pmVar5->muy = u.uy;
    if ((u._1052_1_ & 0x10) != 0) {
      return 0;
    }
    uVar9 = (uint)CONCAT71((int7)((ulong)uVar22 >> 8),1);
    uVar18 = 0;
  }
  ppVar11 = youmonst.data;
  cVar17 = (char)uVar18;
  cVar20 = (char)uVar9;
  if (((((u._1052_1_ & 1) == 0) && ((u._1052_1_ & 4) != 0)) && (cVar17 == '\0')) && (cVar20 != '\0')
     ) {
    u._1052_1_ = u._1052_1_ & 0xfa;
    if (((youmonst.data)->mflags1 & 0x100) != 0) {
      pcVar12 = ceiling((int)u.ux,(int)u.uy);
      pline("You fall from the %s!",pcVar12);
      bVar6 = enexto((coord *)local_138,level,u.ux,u.uy,youmonst.data);
      if (bVar6 == '\0') {
        pcVar12 = Monnam(mtmp);
        pcVar13 = mons_mname(youmonst.data);
        pline("%s is killed by a falling %s (you)!",pcVar12,pcVar13);
        killed(mtmp);
        newsym((int)u.ux,(int)u.uy);
        return (uint)(mtmp->mhp < 1);
      }
      remove_monster(level,(int)mtmp->mx,(int)mtmp->my);
      newsym((int)mtmp->mx,(int)mtmp->my);
      place_monster(mtmp,(int)u.ux,(int)u.uy);
      if (mtmp->wormno != '\0') {
        worm_move(mtmp);
      }
      teleds((int)(char)local_138[0].offensive,(int)local_138[0].offensive._1_1_,'\x01');
      set_apparxy(level,mtmp);
      newsym((int)u.ux,(int)u.uy);
      if ((youmonst.data)->mlet == '\x10') {
        poVar10 = which_armor(mtmp,4);
        if ((poVar10 == (obj *)0x0) ||
           (6 < (ushort)((*(ushort *)&objects[poVar10->otyp].field_0x11 >> 4 & 0x1f) - 0xb))) {
          iVar7 = find_mac(mtmp);
          uVar9 = mt_random();
          pcVar12 = Monnam(mtmp);
          if (iVar7 + 2 <= (int)(uVar9 % 0x14)) {
            pline("%s is hit by a falling piercer (you)!",pcVar12);
            iVar7 = 3;
            iVar21 = -3;
            do {
              uVar9 = mt_random();
              iVar7 = iVar7 + uVar9 % 6;
              iVar21 = iVar21 + 1;
            } while (iVar21 != 0);
            piVar1 = &mtmp->mhp;
            iVar21 = *piVar1;
            *piVar1 = *piVar1 - iVar7;
            if (*piVar1 != 0 && SBORROW4(iVar21,iVar7) == *piVar1 < 0) {
              return 0;
            }
            killed(mtmp);
            return 0;
          }
          pcVar13 = "%s is almost hit by a falling piercer (you)!";
        }
        else {
          pcVar12 = mon_nam(mtmp);
          pcVar12 = s_suffix(pcVar12);
          pcVar13 = "Your blow glances off %s helmet.";
        }
        pline(pcVar13,pcVar12);
        return 0;
      }
      return 0;
    }
    if (bVar24 == 0) {
      poVar10 = level->objects[u.ux][u.uy];
      if (poVar10 == (obj *)0x0) {
        if (((youmonst.data)->mlet != '9') ||
           (bVar6 = is_pool(level,(int)u.ux,(int)u.uy), bVar6 == '\0')) {
          warning("hiding under nothing?");
          goto LAB_001ccd8f;
        }
        sVar2 = '\0';
        ppVar11 = youmonst.data;
      }
      else {
        sVar2 = poVar10->spe;
        if (poVar10->otyp == 0x10f) {
          poVar10->spe = '\0';
        }
      }
      cVar17 = ppVar11->mlet;
      pcVar12 = m_monnam(mtmp);
      pcVar13 = mons_mname(youmonst.data);
      if (cVar17 == '9') {
        pline("Wait, %s!  There\'s a hidden %s named %s there!",pcVar12,pcVar13,plname);
      }
      else {
        pcVar14 = doname(level->objects[u.ux][u.uy]);
        pline("Wait, %s!  There\'s a %s named %s hiding under %s!",pcVar12,pcVar13,plname,pcVar14);
      }
      if (poVar10 != (obj *)0x0) {
        poVar10->spe = sVar2;
      }
    }
    else {
      pline("It tries to move where you are hiding.");
    }
LAB_001ccd8f:
    newsym((int)u.ux,(int)u.uy);
    return 0;
  }
  if (((youmonst.m_ap_type == '\0' || cVar17 != '\0') || (youmonst.data)->mlet != '\r') ||
     (cVar20 == '\0')) {
    if ((youmonst.m_ap_type == '\x02' && cVar17 == '\0') &&
       ((cVar20 != '\0' && ((u._1052_1_ & 1) == 0)))) {
      if (bVar24 == 0) {
        pcVar12 = m_monnam(mtmp);
        pcVar13 = mimic_obj_name(&youmonst);
        pcVar14 = mons_mname(mons + u.umonnum);
        pcVar14 = an(pcVar14);
        pline("Wait, %s!  That %s is really %s named %s!",pcVar12,pcVar13,pcVar14,plname);
      }
      else {
        pcVar12 = "tries to pick you up";
        if (youmonst.mappearance != 0x1ef) {
          pcVar12 = "disturbs you";
        }
        if ((mtmp->data->mflags2 & 0x10000000) == 0) {
          pcVar12 = "disturbs you";
        }
        pline("Something %s!",pcVar12);
      }
      if (multi < 0) {
        if (u.umonnum == u.umonster) {
          pcVar12 = "yourself";
        }
        else {
          pcVar12 = mons_mname(youmonst.data);
          pcVar12 = an(pcVar12);
        }
        sprintf((char *)local_138,"You appear to be %s again.",pcVar12);
        unmul((char *)local_138);
        return 0;
      }
      return 0;
    }
  }
  else if ((u._1052_1_ & 1) == 0) {
    if (bVar24 == 0) {
      pcVar12 = m_monnam(mtmp);
      pcVar13 = mons_mname(youmonst.data);
      pline("Wait, %s!  That\'s a %s named %s!",pcVar12,pcVar13,plname);
    }
    else {
      pline("It gets stuck on you.");
    }
    youmonst.m_ap_type = '\0';
    youmonst.mappearance = 0;
    u.ustuck = mtmp;
    goto LAB_001ccd8f;
  }
  uVar15 = (uint)u.uac;
  if (u.uac < '\0') {
    uVar8 = mt_random();
    uVar15 = ~(uVar8 % -uVar15);
  }
  iVar7 = mtmp->m_lev + uVar15 + (multi >> 0x1f) * -4;
  iVar21 = iVar7 + 10;
  if ((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
        (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
      (u.uprops[0xd].blocked == 0)) && ((local_278->mflags1 & 0x1000000) == 0)) {
    uVar15 = *(uint *)&mtmp->field_0x60;
LAB_001cca1f:
    iVar21 = iVar7 + 8;
  }
  else {
    uVar15 = *(uint *)&mtmp->field_0x60;
    if ((uVar15 >> 0x11 & 1) == 0) goto LAB_001cca1f;
  }
  iVar7 = iVar21 + -2;
  if ((uVar15 >> 0x17 & 1) == 0) {
    iVar7 = iVar21;
  }
  local_27c = 1;
  if (1 < iVar7) {
    local_27c = iVar7;
  }
  if ((local_278->mlet == '9') && ((uVar15 & 2) != 0)) {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
      *(uint *)&mtmp->field_0x60 = uVar15 & 0xfffffffd;
      newsym((int)mtmp->mx,(int)mtmp->my);
      uVar15 = *(uint *)&mtmp->field_0x60;
    }
  }
  if ((((uVar15 & 0x70) == 0) && ((local_278->mflags2 & 0x200) != 0 && cVar17 == '\0')) &&
     (ppVar11 = mtmp->data,
     ppVar11 != mons + 0x130 && (ppVar11 != mons + 0x12f && ppVar11 != mons + 0x13a))) {
    if (uwep == (obj *)0x0) {
      if ((uVar15 >> 8 & 1) == 0) goto LAB_001cce47;
    }
    else if (((uVar15 >> 8 & 1) == 0) && (uwep->oartifact != '\x0e')) {
LAB_001cce47:
      uVar15 = mt_random();
      if (uVar15 * -0x3b13b13b < 0x13b13b14) {
        msummon(mtmp,&mtmp->dlevel->z);
      }
    }
  }
  if (((mtmp->field_0x60 & 0x70) == 0) && ((local_278->mflags2 & 4) != 0 && cVar17 == '\0')) {
    if ((local_278->mflags2 & 8) == 0) {
      uVar15 = mt_random();
      if ((uVar15 * -0x11111111 >> 1 | (uint)((uVar15 * -0x11111111 & 1) != 0) << 0x1f) < 0x8888889)
      {
LAB_001cced1:
        if ((mtmp->field_0x61 & 1) == 0) {
          new_were(mtmp);
        }
      }
    }
    else {
      iVar7 = night();
      uVar15 = mt_random();
      if (SUB168(ZEXT416(uVar15) % SEXT816((long)(iVar7 * -2 + 5)),0) == 0) goto LAB_001cced1;
    }
    local_278 = mtmp->data;
    uVar15 = mt_random();
    if (((uVar15 * -0x33333333 >> 1 | (uint)((uVar15 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a)
       && ((mtmp->field_0x61 & 1) == 0)) {
      local_238[0] = 0x61657263;
      local_238[1] = 0x65727574;
      local_230 = 0;
      iVar7 = were_summon(local_278,'\0',(int *)&local_26c,(char *)local_238);
      if (bVar24 == 0) {
        pcVar12 = Monnam(mtmp);
        pline("%s summons help!",pcVar12);
        if (iVar7 < 1) {
          pline("But none comes.");
        }
        else if (local_26c == (attack)0x0) goto LAB_001ccfe5;
      }
      else {
        if (flags.soundok == '\0') {
          pcVar12 = " from nowhere";
        }
        else {
          pcVar12 = growl_sound(mtmp);
          pcVar12 = makeplural(pcVar12);
          pline("Something %s!",pcVar12);
          pcVar12 = "";
        }
        if (0 < iVar7) {
          if ((int)local_26c < 1) {
LAB_001ccfe5:
            pline("You feel hemmed in.");
          }
          else {
            local_268 = pcVar12;
            if (local_26c == (attack)0x1) {
              pcVar12 = an((char *)local_238);
              pcVar13 = "%s appears";
            }
            else {
              pcVar12 = makeplural((char *)local_238);
              pcVar13 = "%s appear";
            }
            sprintf((char *)local_138,pcVar13,pcVar12);
            pcVar12 = upstart((char *)local_138);
            pline("%s%s!",pcVar12,local_268);
          }
        }
      }
    }
  }
  if ((u._1052_1_ & 0x10) == 0) {
    local_268 = (char *)CONCAT44(local_268._4_4_,uVar18);
    local_138[0].misc = (obj *)0x0;
    local_138[0].has_offense = MUSE_NONE;
    local_138[0].has_defense = MUSE_NONE;
    local_138[0].offensive = (obj *)0x0;
    local_138[0].defensive = (obj *)0x0;
    local_138[0].has_misc = MUSE_NONE;
    local_138[0]._36_4_ = 0;
    bVar6 = find_offensive(mtmp,local_138);
    if (bVar6 != '\0') {
      iVar7 = use_offensive(mtmp,local_138);
      if (iVar7 != 0) {
        return (uint)(iVar7 == 1);
      }
    }
    lVar16 = 0x10;
    local_248 = &u.uz;
    local_250 = &dungeon_topology.d_rogue_level;
    local_25c = uVar9;
    local_254 = uVar9 & 0xff;
    local_240 = mons + 0x127;
    uVar23 = 0;
    do {
      local_238[uVar23] = 0;
      mattk = (attack *)((long)&((permonst *)(local_278->mattk + -4))->mname + lVar16);
      if ((uVar23 != 0) && (0 < *(int *)((long)&local_240 + uVar23 * 4 + 4))) {
        bVar3 = local_278->mattk[uVar23].adtyp;
        if (((ulong)bVar3 < 0x28) &&
           (((0xc200000000U >> ((ulong)bVar3 & 0x3f) & 1) != 0 &&
            (bVar3 == local_278->mattk[uVar23 - 1].adtyp)))) {
          local_26c._2_2_ = SUB42(local_278->mattk[uVar23],2);
          local_26c.aatyp = local_278->mattk[uVar23].aatyp;
          local_26c.adtyp = '\f';
          mattk = &local_26c;
        }
      }
      uVar4 = mattk->aatyp;
      iVar7 = (int)uVar23;
      if ((u._1052_1_ & 1) == 0) {
        switch(uVar4) {
        case '\x01':
        case '\x02':
        case '\x03':
        case '\x04':
        case '\x05':
        case '\x06':
        case '\x10':
          if (((byte)local_268 == 0) &&
             ((((mtmp->mw == (obj *)0x0 || ((mtmp->field_0x62 & 0x20) != 0)) ||
               (u.uprops[0x15].intrinsic != 0)) ||
              ((u.uprops[0x15].extrinsic != 0 ||
               (youmonst.data != mons + 0xb && youmonst.data != mons + 0xc)))))) {
            if ((char)local_25c == '\0') {
LAB_001cd5a2:
              wildmiss(mtmp,mattk);
            }
            else {
              uVar9 = mt_random();
              iVar7 = uVar9 % (iVar7 + 0x14U) + 1;
              if (iVar7 < local_27c) {
                if ((mattk->aatyp != '\x03') || (((youmonst.data)->mflags1 & 0x200000) == 0))
                goto LAB_001cd514;
              }
              else {
LAB_001cd3f8:
                missmu(mtmp,local_27c == iVar7,mattk);
              }
            }
          }
          break;
        case '\a':
          if (((~(byte)local_268 & 1 < uVar23) == 0) ||
             (*(int *)((long)&local_240 + uVar23 * 4 + 4) == 0)) {
            if (u.ustuck == mtmp) goto LAB_001cd514;
          }
          else if (u.ustuck == mtmp || *(int *)((long)&local_240 + uVar23 * 4) != 0) {
LAB_001cd514:
            iVar7 = hitmu(mtmp,mattk);
            goto LAB_001cd5c3;
          }
          break;
        case '\b':
        case '\t':
        case '\x0e':
          break;
        case '\n':
          if ((byte)local_268 != 0) {
            iVar7 = spitmu(mtmp,mattk);
LAB_001cd5c3:
            local_238[uVar23] = iVar7;
          }
          break;
        case '\v':
switchD_001cd278_caseD_b:
          if ((byte)local_268 == 0) {
            if ((char)local_25c != '\0') {
              if ((u._1052_1_ & 1) == 0) {
                uVar9 = mt_random();
                iVar7 = uVar9 % (iVar7 + 0x14U) + 1;
                if (local_27c <= iVar7) goto LAB_001cd3f8;
              }
              flush_screen();
              iVar7 = gulpmu(mtmp,mattk);
              goto LAB_001cd5c3;
            }
            ppVar11 = mtmp->data;
            if ((ppVar11->mflags1 & 0x40000) == 0) {
              if (bVar24 != 0) {
                pcVar12 = "splat";
                if (ppVar11 == mons + 0x9f) {
                  pcVar12 = "rushing noise";
                }
                if (ppVar11->mlet == '\x16') {
                  pcVar12 = "rushing noise";
                }
                You_hear("a %s nearby.",pcVar12);
                break;
              }
              pcVar12 = Monnam(mtmp);
              pcVar13 = "%s lunges forward and recoils!";
            }
            else {
              pcVar12 = Monnam(mtmp);
              pcVar13 = "%s gulps some air!";
            }
            pline(pcVar13,pcVar12);
          }
          break;
        case '\f':
          if ((byte)local_268 != 0) {
            iVar7 = breamu(mtmp,mattk);
            goto LAB_001cd5c3;
          }
          break;
        case '\r':
          if ((byte)local_268 == 0) {
            iVar7 = explmu(mtmp,mattk,(boolean)local_254);
            goto LAB_001cd5c3;
          }
          break;
        case '\x0f':
          if (local_278 != local_240) {
            iVar7 = gazemu(mtmp,mattk);
            goto LAB_001cd5c3;
          }
          break;
        default:
          if (uVar4 == 0xfe) {
            if ((byte)local_268 == 0) {
              if ((mtmp->weapon_check == '\x01') || (mtmp->mw == (obj *)0x0)) {
                mtmp->weapon_check = '\x03';
                iVar21 = mon_wield_item(mtmp);
                if (iVar21 != 0) break;
              }
              if ((char)local_25c == '\0') goto LAB_001cd5a2;
              otmp = mtmp->mw;
              if (otmp == (obj *)0x0) {
                local_258 = 0;
              }
              else {
                local_258 = hitval(otmp,&youmonst);
                local_27c = local_27c + local_258;
                mswings(mtmp,otmp);
              }
              uVar9 = mt_random();
              dieroll = uVar9 % (iVar7 + 0x14U) + 1;
              if (dieroll < local_27c) {
                iVar7 = hitmu(mtmp,mattk);
                local_238[uVar23] = iVar7;
              }
              else {
                missmu(mtmp,local_27c == dieroll,mattk);
              }
              iVar7 = local_258;
              if (otmp == (obj *)0x0) {
                iVar7 = 0;
              }
              local_27c = local_27c - iVar7;
            }
            else {
              bVar6 = on_level(local_248,local_250);
              if (bVar6 == '\0') {
                thrwmu(mtmp);
              }
            }
          }
          else if (uVar4 == 0xff) {
            if ((byte)local_268 == 0) {
              iVar7 = castmu(mtmp,mattk,'\x01',(boolean)local_254);
            }
            else {
              iVar7 = buzzmu(mtmp,mattk);
            }
            goto LAB_001cd5c3;
          }
        }
        if (iflags.botl != '\0') {
          bot();
        }
        iVar7 = local_238[uVar23];
        if (((iVar7 == 1) && (u.usleep != 0)) && ((uint)u.usleep < moves)) {
          if (u.uprops[3].intrinsic == 0 && u.uprops[3].extrinsic == 0) {
            if (((byte)youmonst.mintrinsics & 4) == 0) {
              uVar19 = 10;
              goto LAB_001cd653;
            }
          }
          else if ((((u.uprops[3].intrinsic >> 0x1a & 1) != 0) &&
                   ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)) &&
                  (((byte)youmonst.mintrinsics & 4) == 0)) {
            uVar19 = 5;
LAB_001cd653:
            if ((u.uprops[0x38].extrinsic == 0) &&
               (uVar9 = mt_random(), (int)((ulong)uVar9 % uVar19) != 0)) goto LAB_001cd689;
          }
          multi = -1;
          nomovemsg = "The combat suddenly awakens you.";
        }
        else {
          if (iVar7 == 2) {
            return 1;
          }
          if (iVar7 == 3) {
            return 0;
          }
        }
      }
      else if (uVar4 == '\v') goto switchD_001cd278_caseD_b;
LAB_001cd689:
      uVar23 = uVar23 + 1;
      lVar16 = lVar16 + 4;
      if (uVar23 == 6) {
        return 0;
      }
    } while( true );
  }
  if (u.ustuck == mtmp) {
    pcVar12 = Monnam(mtmp);
    pcVar13 = "%s loosens its grip slightly.";
    goto LAB_001cd7a9;
  }
  if (cVar17 != '\0') {
    return 0;
  }
  if (bVar24 != 0) {
    if (((mtmp->data->mflags1 & 0x10000) == 0) &&
       ((poVar10 = which_armor(mtmp,4), poVar10 == (obj *)0x0 ||
        (poVar10 = which_armor(mtmp,4), poVar10->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001cd12b;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001cd126;
      }
      else {
LAB_001cd126:
        if (ublindf != (obj *)0x0) {
LAB_001cd12b:
          if (ublindf->oartifact == '\x1d') goto LAB_001cd74a;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001cd79a;
      }
LAB_001cd74a:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar7 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar7 < 0x41))))
      goto LAB_001cd79a;
    }
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar6 = match_warn_of_mon(mtmp), bVar6 == '\0')))) {
      pline("You feel something move nearby.");
      return 0;
    }
  }
LAB_001cd79a:
  pcVar12 = Monnam(mtmp);
  pcVar13 = "%s starts to attack you, but pulls back.";
LAB_001cd7a9:
  pline(pcVar13,pcVar12);
  return 0;
}

Assistant:

int mattacku(struct monst *mtmp)
{
	const struct attack *mattk;
	struct attack alt_attk;
	int	i, j, tmp, sum[NATTK];
	struct musable musable;
	
	const struct permonst *mdat = mtmp->data;
	boolean ranged = (distu(mtmp->mx, mtmp->my) > 3);
		/* Is it near you?  Affects your actions */
	boolean range2 = !monnear(mtmp, mtmp->mux, mtmp->muy);
		/* Does it think it's near you?  Affects its actions */
	boolean foundyou = (mtmp->mux==u.ux && mtmp->muy==u.uy);
		/* Is it attacking you or your image? */
	boolean youseeit = canseemon(level, mtmp);
		/* Might be attacking your image around the corner, or
		 * invisible, or you might be blind....
		 */
	
	if (!ranged) nomul(0, NULL);
	if (mtmp->mhp <= 0 || (Underwater && !is_swimmer(mtmp->data)))
	    return 0;

	/* If swallowed, can only be affected by u.ustuck */
	if (u.uswallow) {
	    if (mtmp != u.ustuck)
		return 0;
	    u.ustuck->mux = u.ux;
	    u.ustuck->muy = u.uy;
	    range2 = 0;
	    foundyou = 1;
	    if (u.uinvulnerable) return 0; /* stomachs can't hurt you! */
	}

	else if (u.usteed) {
		if (mtmp == u.usteed)
			/* Your steed won't attack you */
			return 0;
		/* Orcs like to steal and eat horses and the like */
		if (!rn2(is_orc(mtmp->data) ? 2 : 4) &&
				distu(mtmp->mx, mtmp->my) <= 2) {
			/* Attack your steed instead */
			i = mattackm(mtmp, u.usteed);
			if ((i & MM_AGR_DIED))
				return 1;
			if (i & MM_DEF_DIED || u.umoved)
				return 0;
			/* Let your steed retaliate */
			return !!(mattackm(u.usteed, mtmp) & MM_DEF_DIED);
		}
	}

	if (u.uundetected && !range2 && foundyou && !u.uswallow) {
		u.uundetected = 0;
		if (is_hider(youmonst.data)) {
		    coord cc; /* maybe we need a unexto() function? */
		    struct obj *obj;

		    pline("You fall from the %s!", ceiling(u.ux,u.uy));
		    if (enexto(&cc, level, u.ux, u.uy, youmonst.data)) {
			remove_monster(level, mtmp->mx, mtmp->my);
			newsym(mtmp->mx,mtmp->my);
			place_monster(mtmp, u.ux, u.uy);
			if (mtmp->wormno) worm_move(mtmp);
			teleds(cc.x, cc.y, TRUE);
			set_apparxy(level, mtmp);
			newsym(u.ux,u.uy);
		    } else {
			pline("%s is killed by a falling %s (you)!",
					Monnam(mtmp), mons_mname(youmonst.data));
			killed(mtmp);
			newsym(u.ux,u.uy);
			if (mtmp->mhp > 0) return 0;
			else return 1;
		    }
		    if (youmonst.data->mlet != S_PIERCER)
			return 0;	/* trappers don't attack */

		    obj = which_armor(mtmp, WORN_HELMET);
		    if (obj && is_metallic(obj)) {
			pline("Your blow glances off %s helmet.",
			               s_suffix(mon_nam(mtmp)));
		    } else {
			if (3 + find_mac(mtmp) <= rnd(20)) {
			    pline("%s is hit by a falling piercer (you)!",
								Monnam(mtmp));
			    if ((mtmp->mhp -= dice(3,6)) < 1)
				killed(mtmp);
			} else
			  pline("%s is almost hit by a falling piercer (you)!",
								Monnam(mtmp));
		    }
		} else {
		    if (!youseeit)
			pline("It tries to move where you are hiding.");
		    else {
			/* Ugly kludge for eggs.  The message is phrased so as
			 * to be directed at the monster, not the player,
			 * which makes "laid by you" wrong.  For the
			 * parallelism to work, we can't rephrase it, so we
			 * zap the "laid by you" momentarily instead.
			 */
			struct obj *obj = level->objects[u.ux][u.uy];

			if (obj ||
			      (youmonst.data->mlet == S_EEL && is_pool(level, u.ux, u.uy))) {
			    int save_spe = 0; /* suppress warning */
			    if (obj) {
				save_spe = obj->spe;
				if (obj->otyp == EGG) obj->spe = 0;
			    }
			    if (youmonst.data->mlet == S_EEL)
		pline("Wait, %s!  There's a hidden %s named %s there!",
				m_monnam(mtmp), mons_mname(youmonst.data), plname);
			    else
	     pline("Wait, %s!  There's a %s named %s hiding under %s!",
				m_monnam(mtmp), mons_mname(youmonst.data), plname,
				doname(level->objects[u.ux][u.uy]));
			    if (obj) obj->spe = save_spe;
			} else
			    warning("hiding under nothing?");
		    }
		    newsym(u.ux,u.uy);
		}
		return 0;
	}
	if (youmonst.data->mlet == S_MIMIC && youmonst.m_ap_type &&
		    !range2 && foundyou && !u.uswallow) {
		if (!youseeit) pline("It gets stuck on you.");
		else pline("Wait, %s!  That's a %s named %s!",
			   m_monnam(mtmp), mons_mname(youmonst.data), plname);
		u.ustuck = mtmp;
		youmonst.m_ap_type = M_AP_NOTHING;
		youmonst.mappearance = 0;
		newsym(u.ux,u.uy);
		return 0;
	}

	/* player might be mimicking an object */
	if (youmonst.m_ap_type == M_AP_OBJECT && !range2 && foundyou && !u.uswallow) {
	    if (!youseeit)
		 pline("Something %s!",
			(likes_gold(mtmp->data) && youmonst.mappearance == GOLD_PIECE) ?
			"tries to pick you up" : "disturbs you");
	    else pline("Wait, %s!  That %s is really %s named %s!",
			m_monnam(mtmp),
			mimic_obj_name(&youmonst),
			an(mons_mname(&mons[u.umonnum])),
			plname);
	    if (multi < 0) {	/* this should always be the case */
		char buf[BUFSZ];
		sprintf(buf, "You appear to be %s again.",
			Upolyd ? (const char *) an(mons_mname(youmonst.data)) :
			    (const char *) "yourself");
		unmul(buf);	/* immediately stop mimicking */
	    }
	    return 0;
	}

/*	Work out the armor class differential	*/
	tmp = AC_VALUE(u.uac) + 10;		/* tmp ~= 0 - 20 */
	tmp += mtmp->m_lev;
	if (multi < 0) tmp += 4;
	if ((Invis && !perceives(mdat)) || !mtmp->mcansee)
		tmp -= 2;
	if (mtmp->mtrapped) tmp -= 2;
	if (tmp <= 0) tmp = 1;

	/* make eels visible the moment they hit/miss us */
	if (mdat->mlet == S_EEL && mtmp->minvis && cansee(mtmp->mx,mtmp->my)) {
		mtmp->minvis = 0;
		newsym(mtmp->mx,mtmp->my);
	}

/*	Special demon handling code */
	if (!mtmp->cham && is_demon(mdat) && !range2
	   && mtmp->data != &mons[PM_BALROG]
	   && mtmp->data != &mons[PM_SUCCUBUS]
	   && mtmp->data != &mons[PM_INCUBUS]
	   && (!uwep || uwep->oartifact != ART_DEMONBANE))
	    if (!mtmp->mcan && !rn2(13))	msummon(mtmp, &mtmp->dlevel->z);

/*	Special lycanthrope handling code */
	if (!mtmp->cham && is_were(mdat) && !range2) {

	    if (is_human(mdat)) {
		if (!rn2(5 - (night() * 2)) && !mtmp->mcan) new_were(mtmp);
	    } else if (!rn2(30) && !mtmp->mcan) new_were(mtmp);
	    mdat = mtmp->data;

	    if (!rn2(10) && !mtmp->mcan) {
	    	int numseen, numhelp;
		char buf[BUFSZ], genericwere[BUFSZ];

		strcpy(genericwere, "creature");
		numhelp = were_summon(mdat, FALSE, &numseen, genericwere);
		if (youseeit) {
			pline("%s summons help!", Monnam(mtmp));
			if (numhelp > 0) {
			    if (numseen == 0)
				pline("You feel hemmed in.");
			} else pline("But none comes.");
		} else {
			const char *from_nowhere;

			if (flags.soundok) {
				pline("Something %s!",
					makeplural(growl_sound(mtmp)));
				from_nowhere = "";
			} else from_nowhere = " from nowhere";
			if (numhelp > 0) {
			    if (numseen < 1) pline("You feel hemmed in.");
			    else {
				if (numseen == 1)
			    		sprintf(buf, "%s appears",
							an(genericwere));
			    	else
			    		sprintf(buf, "%s appear",
							makeplural(genericwere));
				pline("%s%s!", upstart(buf), from_nowhere);
			    }
			} /* else no help came; but you didn't know it tried */
		}
	    }
	}

	if (u.uinvulnerable) {
	    /* monsters won't attack you */
	    if (mtmp == u.ustuck)
		pline("%s loosens its grip slightly.", Monnam(mtmp));
	    else if (!range2) {
		if (youseeit || sensemon(mtmp))
		    pline("%s starts to attack you, but pulls back.",
			  Monnam(mtmp));
		else
		    pline("You feel something move nearby.");
	    }
	    return 0;
	}

	/* Unlike defensive stuff, don't let them use item _and_ attack. */
	memset(&musable, 0, sizeof(musable));
	if (find_offensive(mtmp, &musable)) {
		int foo = use_offensive(mtmp, &musable);

		if (foo != 0) return foo==1;
	}

	for (i = 0; i < NATTK; i++) {

	    sum[i] = 0;
	    mattk = getmattk(mdat, i, sum, &alt_attk);
	    if (u.uswallow && (mattk->aatyp != AT_ENGL))
		continue;
	    switch(mattk->aatyp) {
		case AT_CLAW:	/* "hand to hand" attacks */
		case AT_KICK:
		case AT_BITE:
		case AT_STNG:
		case AT_TUCH:
		case AT_BUTT:
		case AT_TENT:
			if (!range2 && (!MON_WEP(mtmp) || mtmp->mconf || Conflict ||
					!touch_petrifies(youmonst.data))) {
			    if (foundyou) {
				if (tmp > (j = rnd(20+i))) {
				    if (mattk->aatyp != AT_KICK ||
					    !thick_skinned(youmonst.data))
					sum[i] = hitmu(mtmp, mattk);
				} else
				    missmu(mtmp, (tmp == j), mattk);
			    } else
				wildmiss(mtmp, mattk);
			}
			break;

		case AT_HUGS:	/* automatic if prev two attacks succeed */
			/* Note: if displaced, prev attacks never succeeded */
			if ((!range2 && i>=2 && sum[i-1] && sum[i-2])
							|| mtmp == u.ustuck)
				sum[i]= hitmu(mtmp, mattk);
			break;

		case AT_GAZE:	/* can affect you either ranged or not */
			/* Medusa gaze already operated through m_respond in
			 * dochug(); don't gaze more than once per round.
			 */
			if (mdat != &mons[PM_MEDUSA])
				sum[i] = gazemu(mtmp, mattk);
			break;

		case AT_EXPL:	/* automatic hit if next to, and aimed at you */
			if (!range2) sum[i] = explmu(mtmp, mattk, foundyou);
			break;

		case AT_ENGL:
			if (!range2) {
			    if (foundyou) {
				if (u.uswallow || tmp > (j = rnd(20+i))) {
				    /* Force swallowing monster to be
				     * displayed even when player is
				     * moving away */
				    flush_screen();
				    sum[i] = gulpmu(mtmp, mattk);
				} else {
				    missmu(mtmp, (tmp == j), mattk);
				}
			    } else if (is_animal(mtmp->data)) {
				pline("%s gulps some air!", Monnam(mtmp));
			    } else {
				if (youseeit)
				    pline("%s lunges forward and recoils!",
					  Monnam(mtmp));
				else
				    You_hear("a %s nearby.",
					     is_whirly(mtmp->data) ?
						"rushing noise" : "splat");
			   }
			}
			break;
		case AT_BREA:
			if (range2) sum[i] = breamu(mtmp, mattk);
			/* Note: breamu takes care of displacement */
			break;
		case AT_SPIT:
			if (range2) sum[i] = spitmu(mtmp, mattk);
			/* Note: spitmu takes care of displacement */
			break;
		case AT_WEAP:
			if (range2) {
				if (!Is_rogue_level(&u.uz))
					thrwmu(mtmp);
			} else {
			    int hittmp = 0;

			    /* Rare but not impossible.  Normally the monster
			     * wields when 2 spaces away, but it can be
			     * teleported or whatever....
			     */
			    if (mtmp->weapon_check == NEED_WEAPON ||
							!MON_WEP(mtmp)) {
				mtmp->weapon_check = NEED_HTH_WEAPON;
				/* mon_wield_item resets weapon_check as
				 * appropriate */
				if (mon_wield_item(mtmp) != 0) break;
			    }
			    if (foundyou) {
				otmp = MON_WEP(mtmp);
				if (otmp) {
				    hittmp = hitval(otmp, &youmonst);
				    tmp += hittmp;
				    mswings(mtmp, otmp);
				}
				if (tmp > (j = dieroll = rnd(20+i)))
				    sum[i] = hitmu(mtmp, mattk);
				else
				    missmu(mtmp, (tmp == j), mattk);
				/* KMH -- Don't accumulate to-hit bonuses */
				if (otmp)
					tmp -= hittmp;
			    } else
				wildmiss(mtmp, mattk);
			}
			break;
		case AT_MAGC:
			if (range2)
			    sum[i] = buzzmu(mtmp, mattk);
			else
			    sum[i] = castmu(mtmp, mattk, TRUE, foundyou);
			break;

		default:		/* no attack */
			break;
	    }
	    if (iflags.botl) bot();
	/* give player a chance of waking up before dying -kaa */
	    if (sum[i] == 1) {	    /* successful attack */
		if (u.usleep && u.usleep < moves &&
		    (FSleep_resistance || !rn2(PSleep_resistance ? 5 : 10))) {
		    multi = -1;
		    nomovemsg = "The combat suddenly awakens you.";
		}
	    }
	    if (sum[i] == 2) return 1;		/* attacker dead */
	    if (sum[i] == 3) break;  /* attacker teleported, no more attacks */
	    /* sum[i] == 0: unsuccessful attack */
	}
	return 0;
}